

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

void getnameinfo_req(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  if (handle == (uv_getnameinfo_t *)0x0) {
    getnameinfo_req_cold_4();
LAB_00159293:
    getnameinfo_req_cold_1();
LAB_00159298:
    getnameinfo_req_cold_3();
  }
  else {
    if (status != 0) goto LAB_00159293;
    if (hostname == (char *)0x0) goto LAB_00159298;
    if (service != (char *)0x0) {
      return;
    }
  }
  getnameinfo_req_cold_2();
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    if (iVar1 != 0) goto LAB_00159332;
    if (req.host[0] == '\0') goto LAB_00159337;
    if (req.service[0] == '\0') goto LAB_0015933c;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_00159332:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_00159337:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0015933c:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  puVar2 = (uv_loop_t *)0x199c19;
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001593dd;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_001593dd:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return;
}

Assistant:

static void getnameinfo_req(uv_getnameinfo_t* handle,
                            int status,
                            const char* hostname,
                            const char* service) {
  ASSERT(handle != NULL);
  ASSERT(status == 0);
  ASSERT(hostname != NULL);
  ASSERT(service != NULL);
}